

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdist.c
# Opt level: O3

void qdist_bin__internal(qdist *to,qdist *from,size_t n)

{
  double *pdVar1;
  double dVar2;
  size_t sVar3;
  gpointer __p;
  qdist_entry *pqVar4;
  qdist_entry *pqVar5;
  gsize gVar6;
  gsize gVar7;
  gsize gVar8;
  ulong uVar9;
  ulong uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  double dVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  double dVar16;
  double dVar17;
  
  pqVar4 = (qdist_entry *)g_malloc(0x10);
  to->entries = pqVar4;
  to->size = 1;
  to->n = 0;
  gVar7 = from->n;
  if (gVar7 != 0) {
    gVar8 = n;
    if (gVar7 == 1) {
      gVar8 = gVar7;
    }
    if (n == 0) {
      gVar8 = gVar7;
    }
    pqVar5 = from->entries;
    dVar2 = pqVar5->x;
    auVar11._8_4_ = (int)(gVar8 >> 0x20);
    auVar11._0_8_ = gVar8;
    auVar11._12_4_ = 0x45300000;
    dVar17 = (*(double *)((long)&pqVar5->x + ((long)((gVar7 << 0x20) + -0x100000000) >> 0x1c)) -
             dVar2) / ((auVar11._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)gVar8) - 4503599627370496.0));
    if (gVar8 == gVar7) {
      gVar6 = 0;
      while( true ) {
        auVar14._8_4_ = (int)(gVar6 >> 0x20);
        auVar14._0_8_ = gVar6;
        auVar14._12_4_ = 0x45300000;
        dVar16 = ((auVar14._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)gVar6) - 4503599627370496.0)) * dVar17 + dVar2;
        if ((pqVar5->x != dVar16) || (NAN(pqVar5->x) || NAN(dVar16))) break;
        gVar6 = gVar6 + 1;
        pqVar5 = pqVar5 + 1;
        if (gVar7 == gVar6) {
          pqVar4 = (qdist_entry *)g_realloc_n(pqVar4,gVar7,0x10);
          to->entries = pqVar4;
          sVar3 = from->n;
          to->n = sVar3;
          memcpy(pqVar4,from->entries,sVar3 << 4);
          return;
        }
      }
    }
    if (gVar8 != 0) {
      uVar9 = 0;
      gVar7 = 0;
      do {
        auVar15._8_4_ = (int)(gVar7 >> 0x20);
        auVar15._0_8_ = gVar7;
        auVar15._12_4_ = 0x45300000;
        dVar16 = ((auVar15._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)gVar7) - 4503599627370496.0)) * dVar17 + dVar2;
        gVar6 = gVar7 + 1;
        qdist_add(to,dVar16,0);
        if (uVar9 < from->n) {
          auVar12._8_4_ = (int)(gVar6 >> 0x20);
          auVar12._0_8_ = gVar6;
          auVar12._12_4_ = 0x45300000;
          dVar13 = ((auVar12._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)gVar6) - 4503599627370496.0)) * dVar17 + dVar2;
          uVar10 = uVar9 << 4 | 8;
          do {
            if ((gVar7 != gVar8 - 1) &&
               (pdVar1 = (double *)((long)from->entries + (uVar10 - 8)),
               dVar13 < *pdVar1 || dVar13 == *pdVar1)) break;
            qdist_add(to,dVar16,*(long *)((long)&from->entries->x + uVar10));
            uVar9 = uVar9 + 1;
            uVar10 = uVar10 + 0x10;
          } while (uVar9 < from->n);
        }
        gVar7 = gVar6;
      } while (gVar6 != gVar8);
    }
  }
  return;
}

Assistant:

void qdist_bin__internal(struct qdist *to, const struct qdist *from, size_t n)
{
    double xmin, xmax;
    double step;
    size_t i, j;

    qdist_init(to);

    if (from->n == 0) {
        return;
    }
    if (n == 0 || from->n == 1) {
        n = from->n;
    }

    /* set equally-sized bins between @from's left and right */
    xmin = qdist_xmin(from);
    xmax = qdist_xmax(from);
    step = (xmax - xmin) / n;

    if (n == from->n) {
        /* if @from's entries are equally spaced, no need to re-bin */
        for (i = 0; i < from->n; i++) {
            if (from->entries[i].x != xmin + i * step) {
                goto rebin;
            }
        }
        /* they're equally spaced, so copy the dist and bail out */
        to->entries = g_renew(struct qdist_entry, to->entries, n);
        to->n = from->n;
        memcpy(to->entries, from->entries, sizeof(*to->entries) * to->n);
        return;
    }

 rebin:
    j = 0;
    for (i = 0; i < n; i++) {
        double x;
        double left, right;

        left = xmin + i * step;
        right = xmin + (i + 1) * step;

        /* Add x, even if it might not get any counts later */
        x = left;
        qdist_add(to, x, 0);

        /*
         * To avoid double-counting we capture [left, right) ranges, except for
         * the righmost bin, which captures a [left, right] range.
         */
        while (j < from->n && (from->entries[j].x < right || i == n - 1)) {
            struct qdist_entry *o = &from->entries[j];

            qdist_add(to, x, o->count);
            j++;
        }
    }
}